

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGeneratorMocUic.cxx
# Opt level: O0

bool __thiscall
cmQtAutoGeneratorMocUic::ParallelJobPushUic(cmQtAutoGeneratorMocUic *this,JobHandleT *jobHandle)

{
  bool bVar1;
  __type _Var2;
  bool bVar3;
  type pJVar4;
  JobQueueT *this_00;
  reference this_01;
  Logger *this_02;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  allocator<char> local_b9;
  undefined1 local_b8 [8];
  string error;
  JobUicT *otherJob;
  JobHandleT *otherHandle;
  iterator __end2;
  iterator __begin2;
  JobQueueT *__range2;
  JobUicT *uicJob;
  bool pushJobHandle;
  lock_guard<std::mutex> jobsLock;
  JobHandleT *jobHandle_local;
  cmQtAutoGeneratorMocUic *this_local;
  
  jobsLock._M_device = (mutex_type *)jobHandle;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)&stack0xffffffffffffffe0,&this->JobsMutex_);
  if ((this->JobThreadsAbort_ & 1U) == 0) {
    bVar3 = true;
    pJVar4 = std::
             unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
             ::operator*((unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                          *)jobsLock._M_device);
    this_00 = &(this->JobQueues_).Uic;
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
    ::begin((iterator *)&__end2._M_node,this_00);
    std::
    deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_>_>
    ::end((iterator *)&otherHandle,this_00);
    while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&otherHandle), bVar1) {
      this_01 = std::
                _Deque_iterator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_&,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_*>
                ::operator*((_Deque_iterator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_&,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_*>
                             *)&__end2._M_node);
      error.field_2._8_8_ =
           std::
           unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
           ::operator*(this_01);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (error.field_2._8_8_ + 0x48),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (pJVar4 + 9));
      if (_Var2) {
        bVar3 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(error.field_2._8_8_ + 8),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(pJVar4 + 1));
        if (bVar3) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_b8,"The two source files\n  ",&local_b9);
          std::allocator<char>::~allocator(&local_b9);
          cmQtAutoGen::Quoted(&local_e0,(string *)(pJVar4 + 5));
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::operator+=((string *)local_b8," and\n  ");
          cmQtAutoGen::Quoted(&local_100,(string *)(error.field_2._8_8_ + 0x28));
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::operator+=
                    ((string *)local_b8,"\ncontain the same uic include string ");
          cmQtAutoGen::Quoted(&local_120,(string *)(pJVar4 + 9));
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_120);
          std::__cxx11::string::~string((string *)&local_120);
          std::__cxx11::string::operator+=
                    ((string *)local_b8,
                     "\nbut the uic file would be generated from different source files\n  ");
          cmQtAutoGen::Quoted(&local_140,(string *)(pJVar4 + 1));
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
          std::__cxx11::string::operator+=((string *)local_b8," and\n  ");
          cmQtAutoGen::Quoted(&local_160,(string *)(error.field_2._8_8_ + 8));
          std::__cxx11::string::operator+=((string *)local_b8,(string *)&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::__cxx11::string::operator+=
                    ((string *)local_b8,
                     ".\nConsider to\n- add a directory prefix to a \"ui_<NAME>.h\" include (e.g \"sub/ui_<NAME>.h\")\n- rename the <NAME>.ui file(s) and adjust the \"ui_<NAME>.h\" include(s)\n"
                    );
          this_02 = cmQtAutoGenerator::Log(&this->super_cmQtAutoGenerator);
          cmQtAutoGenerator::Logger::Error(this_02,UIC,(string *)local_b8);
          RegisterJobError(this);
          std::__cxx11::string::~string((string *)local_b8);
        }
        bVar3 = false;
        break;
      }
      std::
      _Deque_iterator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_&,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_*>
      ::operator++((_Deque_iterator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_&,_std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>_*>
                    *)&__end2._M_node);
    }
    if (bVar3) {
      std::
      deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
      ::
      emplace_back<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>
                ((deque<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>,std::allocator<std::unique_ptr<cmQtAutoGeneratorMocUic::JobT,std::default_delete<cmQtAutoGeneratorMocUic::JobT>>>>
                  *)&(this->JobQueues_).Uic,
                 (unique_ptr<cmQtAutoGeneratorMocUic::JobT,_std::default_delete<cmQtAutoGeneratorMocUic::JobT>_>
                  *)jobsLock._M_device);
    }
  }
  bVar3 = this->JobError_;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffffe0);
  return (bool)((bVar3 ^ 0xffU) & 1);
}

Assistant:

bool cmQtAutoGeneratorMocUic::ParallelJobPushUic(JobHandleT& jobHandle)
{
  std::lock_guard<std::mutex> jobsLock(JobsMutex_);
  if (!JobThreadsAbort_) {
    bool pushJobHandle = true;
    // Look for include collisions.
    const JobUicT& uicJob(static_cast<JobUicT&>(*jobHandle));
    for (const JobHandleT& otherHandle : JobQueues_.Uic) {
      const JobUicT& otherJob(static_cast<JobUicT&>(*otherHandle));
      if (otherJob.IncludeString == uicJob.IncludeString) {
        // Check if the same uic file would be generated from different
        // source files which would be an error.
        if (otherJob.SourceFile != uicJob.SourceFile) {
          // Include string collision
          std::string error = "The two source files\n  ";
          error += Quoted(uicJob.IncluderFile);
          error += " and\n  ";
          error += Quoted(otherJob.IncluderFile);
          error += "\ncontain the same uic include string ";
          error += Quoted(uicJob.IncludeString);
          error += "\nbut the uic file would be generated from different "
                   "source files\n  ";
          error += Quoted(uicJob.SourceFile);
          error += " and\n  ";
          error += Quoted(otherJob.SourceFile);
          error +=
            ".\nConsider to\n"
            "- add a directory prefix to a \"ui_<NAME>.h\" include "
            "(e.g \"sub/ui_<NAME>.h\")\n"
            "- rename the <NAME>.ui file(s) and adjust the \"ui_<NAME>.h\" "
            "include(s)\n";
          Log().Error(GenT::UIC, error);
          RegisterJobError();
        }
        // Do not push this job in since the uic file already
        // gets generated by an other job.
        pushJobHandle = false;
        break;
      }
    }
    if (pushJobHandle) {
      JobQueues_.Uic.emplace_back(std::move(jobHandle));
    }
  }
  return !JobError_;
}